

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_for_in_of(JSParseState *s,int label_name,BOOL is_async)

{
  JSFunctionDef *pJVar1;
  LabelSlot *pLVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int label_cont_00;
  int iVar6;
  JSAtom name;
  int iVar7;
  int iVar8;
  BOOL BVar9;
  int iVar10;
  int in_EDX;
  char *pcVar11;
  JSAtom in_ESI;
  JSParseState *in_RDI;
  BOOL unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  JSParseState *in_stack_00000018;
  LabelSlot *ls;
  int i;
  int offset;
  int chunk_size;
  DynBuf *bc;
  int lvalue_label;
  int skip_bits;
  BlockEnv break_entry;
  int pos_expr;
  int pos_next;
  int label_break;
  int label_body;
  int label_cont;
  int label_expr;
  int label_next;
  int block_scope_level;
  int scope;
  int opcode;
  int tok1;
  int tok;
  BOOL has_destructuring;
  BOOL is_for_of;
  BOOL has_initializer;
  JSAtom var_name;
  JSFunctionDef *fd;
  JSContext *ctx;
  int in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  uint8_t in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  JSParseState *in_stack_ffffffffffffff38;
  uint8_t uVar12;
  undefined3 uVar13;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  JSParseState *in_stack_ffffffffffffff48;
  PutLValueEnum special;
  int in_stack_ffffffffffffff50;
  JSAtom in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  JSParseState *in_stack_ffffffffffffff60;
  DynBuf *pDVar14;
  int *in_stack_ffffffffffffff68;
  BOOL in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  JSParseState *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff88;
  BOOL in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int local_3c;
  JSAtom local_2c;
  
  pJVar1 = in_RDI->cur_func;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  iVar10 = pJVar1->scope_level;
  label_cont_00 = new_label((JSParseState *)0x19d707);
  new_label((JSParseState *)0x19d71b);
  iVar6 = new_label((JSParseState *)0x19d72c);
  new_label((JSParseState *)0x19d73d);
  push_scope(in_stack_ffffffffffffff48);
  push_break_entry(in_RDI->cur_func,(BlockEnv *)&stack0xffffffffffffff70,in_ESI,iVar6,label_cont_00,
                   1);
  emit_goto((JSParseState *)
            CONCAT17(in_stack_ffffffffffffff2f,
                     CONCAT16(in_stack_ffffffffffffff2e,
                              CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),0,
            0x19d7a2);
  iVar6 = (int)(in_RDI->cur_func->byte_code).size;
  emit_label((JSParseState *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,
                               CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),0);
  local_3c = (in_RDI->token).val;
  name = is_let((JSParseState *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  if (name != 0) {
    if (name != 1) {
      return -1;
    }
    local_3c = -0x2f;
  }
  if (((local_3c == -0x4f) || (local_3c == -0x2f)) || (local_3c == -0x37)) {
    iVar7 = next_token((JSParseState *)CONCAT44(iVar10,in_stack_ffffffffffffff88));
    if (iVar7 != 0) {
      return -1;
    }
    if (((in_RDI->token).val == -0x7d) && ((in_RDI->token).u.ident.is_reserved == 0)) {
      local_2c = JS_DupAtom((JSContext *)CONCAT44(name,in_stack_ffffffffffffff40),
                            (JSAtom)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      iVar7 = next_token((JSParseState *)CONCAT44(iVar10,in_stack_ffffffffffffff88));
      if (iVar7 != 0) {
        JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    CONCAT13(in_stack_ffffffffffffff2f,
                             CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)));
        return -1;
      }
      iVar7 = js_define_var(in_stack_ffffffffffffff48,name,in_stack_ffffffffffffff40);
      if (iVar7 != 0) {
        JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    CONCAT13(in_stack_ffffffffffffff2f,
                             CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)));
        return -1;
      }
      uVar13 = (undefined3)in_stack_ffffffffffffff40;
      in_stack_ffffffffffffff40 = CONCAT13(1,uVar13);
      if (local_3c != -0x37) {
        in_stack_ffffffffffffff40 = CONCAT13(local_3c == -0x2f,uVar13);
      }
      in_stack_ffffffffffffff38 = in_RDI;
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),
              (uint8_t)((ulong)in_RDI >> 0x38));
      emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                CONCAT13(in_stack_ffffffffffffff2f,
                         CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)));
      emit_u16((JSParseState *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               CONCAT11(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff2e));
    }
    else {
      if (((in_RDI->token).val != 0x5b) && ((in_RDI->token).val != 0x7b)) {
        iVar10 = js_parse_error(in_RDI,"variable name expected");
        return iVar10;
      }
      iVar7 = js_parse_destructuring_element
                        (in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
                         in_stack_00000008,unaff_retaddr);
      if (iVar7 < 0) {
        return -1;
      }
      bVar4 = true;
      local_2c = 0;
    }
  }
  else {
    if ((((in_RDI->token).val == 0x5b) || ((in_RDI->token).val == 0x7b)) &&
       ((iVar7 = js_parse_skip_parens_token(_label_break,_pos_expr,break_entry._36_4_),
        iVar7 == -0x49 || (iVar7 == -0x27)))) {
      iVar7 = js_parse_destructuring_element
                        (in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
                         in_stack_00000008,unaff_retaddr);
      if (iVar7 < 0) {
        return -1;
      }
    }
    else {
      special = (PutLValueEnum)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      iVar7 = js_parse_left_hand_side_expr((JSParseState *)0x19dad9);
      if (iVar7 != 0) {
        return -1;
      }
      in_stack_ffffffffffffff30 = 0xffffffbb;
      iVar7 = get_lvalue(in_stack_ffffffffffffff78,
                         (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68,(JSAtom *)in_stack_ffffffffffffff60,
                         (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
      if (iVar7 != 0) {
        return -1;
      }
      in_stack_ffffffffffffff28 = 0;
      put_lvalue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,special,
                 in_stack_ffffffffffffff70);
    }
    local_2c = 0;
  }
  emit_goto((JSParseState *)
            CONCAT17(in_stack_ffffffffffffff2f,
                     CONCAT16(in_stack_ffffffffffffff2e,
                              CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),0,
            0x19db9a);
  iVar7 = (int)(in_RDI->cur_func->byte_code).size;
  emit_label((JSParseState *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,
                               CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),0);
  if ((in_RDI->token).val == 0x3d) {
    bVar3 = true;
    iVar8 = next_token((JSParseState *)CONCAT44(iVar10,in_stack_ffffffffffffff88));
    if ((iVar8 != 0) ||
       (iVar8 = js_parse_assign_expr2
                          ((JSParseState *)CONCAT44(iVar6,iVar7),in_stack_ffffffffffffff94),
       iVar8 != 0)) {
      JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  CONCAT13(in_stack_ffffffffffffff2f,
                           CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)));
      return -1;
    }
    if (local_2c != 0) {
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),
              (uint8_t)((ulong)in_stack_ffffffffffffff38 >> 0x38));
      emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                CONCAT13(in_stack_ffffffffffffff2f,
                         CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)));
      emit_u16((JSParseState *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               CONCAT11(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff2e));
    }
  }
  JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
              CONCAT13(in_stack_ffffffffffffff2f,
                       CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)));
  BVar9 = token_is_pseudo_keyword(in_RDI,0x43);
  if (BVar9 == 0) {
    if ((in_RDI->token).val != -0x49) {
      iVar10 = js_parse_error(in_RDI,"expected \'of\' or \'in\' in for control expression");
      return iVar10;
    }
    if (in_EDX != 0) {
      iVar10 = js_parse_error(in_RDI,"\'for await\' loop should be used with \'of\'");
      return iVar10;
    }
    if (!bVar3) goto LAB_0019ddaf;
    if ((local_3c != -0x4f) || ((pJVar1->js_mode & 1) != 0)) goto LAB_0019dd4b;
  }
  else {
    bVar5 = true;
    bVar4 = bVar3;
  }
  if (bVar4) {
LAB_0019dd4b:
    pcVar11 = "in";
    if (bVar5) {
      pcVar11 = "of";
    }
    iVar10 = js_parse_error(in_RDI,
                            "a declaration in the head of a for-%s loop can\'t have an initializer",
                            pcVar11);
    return iVar10;
  }
LAB_0019ddaf:
  iVar10 = next_token((JSParseState *)CONCAT44(iVar10,in_stack_ffffffffffffff88));
  if (iVar10 != 0) {
    return -1;
  }
  if (bVar5) {
    iVar10 = js_parse_assign_expr((JSParseState *)0x19dde8);
    if (iVar10 != 0) {
      return -1;
    }
  }
  else {
    iVar10 = js_parse_expr((JSParseState *)0x19de0c);
    if (iVar10 != 0) {
      return -1;
    }
  }
  close_scopes((JSParseState *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               CONCAT13(in_stack_ffffffffffffff2f,
                        CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)),
               in_stack_ffffffffffffff28);
  uVar12 = (uint8_t)((ulong)in_stack_ffffffffffffff38 >> 0x38);
  if (bVar5) {
    if (in_EDX == 0) {
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
    }
    else {
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
    }
  }
  else {
    emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
  }
  emit_goto((JSParseState *)
            CONCAT17(in_stack_ffffffffffffff2f,
                     CONCAT16(in_stack_ffffffffffffff2e,
                              CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),0,
            0x19deb0);
  iVar10 = js_parse_expect((JSParseState *)
                           CONCAT17(in_stack_ffffffffffffff2f,
                                    CONCAT16(in_stack_ffffffffffffff2e,
                                             CONCAT24(in_stack_ffffffffffffff2c,
                                                      in_stack_ffffffffffffff28))),0);
  if (iVar10 != 0) {
    return -1;
  }
  pDVar14 = &in_RDI->cur_func->byte_code;
  iVar10 = iVar7 - iVar6;
  iVar8 = (int)(in_RDI->cur_func->byte_code).size - iVar6;
  dbuf_realloc((DynBuf *)in_stack_ffffffffffffff38,
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  dbuf_put((DynBuf *)in_stack_ffffffffffffff38,
           (uint8_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
           CONCAT17(in_stack_ffffffffffffff2f,
                    CONCAT16(in_stack_ffffffffffffff2e,
                             CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))));
  uVar12 = (uint8_t)((ulong)in_stack_ffffffffffffff38 >> 0x38);
  memset(pDVar14->buf + iVar6,0xb1,(long)iVar10);
  in_RDI->cur_func->last_opcode_pos = (int)pDVar14->size + -5;
  for (; label_cont_00 < in_RDI->cur_func->label_count; label_cont_00 = label_cont_00 + 1) {
    pLVar2 = in_RDI->cur_func->label_slots;
    if ((iVar6 <= pLVar2[label_cont_00].pos) && (pLVar2[label_cont_00].pos < iVar7)) {
      pLVar2[label_cont_00].pos = iVar8 + pLVar2[label_cont_00].pos;
    }
  }
  emit_label((JSParseState *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,
                               CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),0);
  iVar10 = js_parse_statement((JSParseState *)0x19e028);
  if (iVar10 != 0) {
    return -1;
  }
  close_scopes((JSParseState *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               CONCAT13(in_stack_ffffffffffffff2f,
                        CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)),
               in_stack_ffffffffffffff28);
  emit_label((JSParseState *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,
                               CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),0);
  if (bVar5) {
    if (in_EDX == 0) {
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
      emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
              in_stack_ffffffffffffff2f);
    }
    else {
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
      emit_u16((JSParseState *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               CONCAT11(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff2e));
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
      emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
    }
  }
  else {
    emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
  }
  emit_goto((JSParseState *)
            CONCAT17(in_stack_ffffffffffffff2f,
                     CONCAT16(in_stack_ffffffffffffff2e,
                              CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),0,
            0x19e148);
  emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
  emit_label((JSParseState *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,
                               CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),0);
  if (bVar5) {
    emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
  }
  else {
    emit_op((JSParseState *)CONCAT44(name,in_stack_ffffffffffffff40),uVar12);
  }
  pop_break_entry(in_RDI->cur_func);
  pop_scope((JSParseState *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  return 0;
}

Assistant:

static __exception int js_parse_for_in_of(JSParseState *s, int label_name,
                                          BOOL is_async)
{
    JSContext *ctx = s->ctx;
    JSFunctionDef *fd = s->cur_func;
    JSAtom var_name;
    BOOL has_initializer, is_for_of, has_destructuring;
    int tok, tok1, opcode, scope, block_scope_level;
    int label_next, label_expr, label_cont, label_body, label_break;
    int pos_next, pos_expr;
    BlockEnv break_entry;

    has_initializer = FALSE;
    has_destructuring = FALSE;
    is_for_of = FALSE;
    block_scope_level = fd->scope_level;
    label_cont = new_label(s);
    label_body = new_label(s);
    label_break = new_label(s);
    label_next = new_label(s);

    /* create scope for the lexical variables declared in the enumeration
       expressions. XXX: Not completely correct because of weird capturing
       semantics in `for (i of o) a.push(function(){return i})` */
    push_scope(s);

    /* local for_in scope starts here so individual elements
       can be closed in statement. */
    push_break_entry(s->cur_func, &break_entry,
                     label_name, label_break, label_cont, 1);
    break_entry.scope_level = block_scope_level;

    label_expr = emit_goto(s, OP_goto, -1);

    pos_next = s->cur_func->byte_code.size;
    emit_label(s, label_next);

    tok = s->token.val;
    switch (is_let(s, DECL_MASK_OTHER)) {
    case TRUE:
        tok = TOK_LET;
        break;
    case FALSE:
        break;
    default:
        return -1;
    }
    if (tok == TOK_VAR || tok == TOK_LET || tok == TOK_CONST) {
        if (next_token(s))
            return -1;

        if (!(s->token.val == TOK_IDENT && !s->token.u.ident.is_reserved)) {
            if (s->token.val == '[' || s->token.val == '{') {
                if (js_parse_destructuring_element(s, tok, 0, TRUE, -1, FALSE) < 0)
                    return -1;
                has_destructuring = TRUE;
            } else {
                return js_parse_error(s, "variable name expected");
            }
            var_name = JS_ATOM_NULL;
        } else {
            var_name = JS_DupAtom(ctx, s->token.u.ident.atom);
            if (next_token(s)) {
                JS_FreeAtom(s->ctx, var_name);
                return -1;
            }
            if (js_define_var(s, var_name, tok)) {
                JS_FreeAtom(s->ctx, var_name);
                return -1;
            }
            emit_op(s, (tok == TOK_CONST || tok == TOK_LET) ?
                    OP_scope_put_var_init : OP_scope_put_var);
            emit_atom(s, var_name);
            emit_u16(s, fd->scope_level);
        }
    } else {
        int skip_bits;
        if ((s->token.val == '[' || s->token.val == '{')
        &&  ((tok1 = js_parse_skip_parens_token(s, &skip_bits, FALSE)) == TOK_IN || tok1 == TOK_OF)) {
            if (js_parse_destructuring_element(s, 0, 0, TRUE, skip_bits & SKIP_HAS_ELLIPSIS, TRUE) < 0)
                return -1;
        } else {
            int lvalue_label;
            if (js_parse_left_hand_side_expr(s))
                return -1;
            if (get_lvalue(s, &opcode, &scope, &var_name, &lvalue_label,
                           NULL, FALSE, TOK_FOR))
                return -1;
            put_lvalue(s, opcode, scope, var_name, lvalue_label,
                       PUT_LVALUE_NOKEEP_BOTTOM, FALSE);
        }
        var_name = JS_ATOM_NULL;
    }
    emit_goto(s, OP_goto, label_body);

    pos_expr = s->cur_func->byte_code.size;
    emit_label(s, label_expr);
    if (s->token.val == '=') {
        /* XXX: potential scoping issue if inside `with` statement */
        has_initializer = TRUE;
        /* parse and evaluate initializer prior to evaluating the
           object (only used with "for in" with a non lexical variable
           in non strict mode */
        if (next_token(s) || js_parse_assign_expr2(s, 0)) {
            JS_FreeAtom(ctx, var_name);
            return -1;
        }
        if (var_name != JS_ATOM_NULL) {
            emit_op(s, OP_scope_put_var);
            emit_atom(s, var_name);
            emit_u16(s, fd->scope_level);
        }
    }
    JS_FreeAtom(ctx, var_name);

    if (token_is_pseudo_keyword(s, JS_ATOM_of)) {
        break_entry.has_iterator = is_for_of = TRUE;
        break_entry.drop_count += 2;
        if (has_initializer)
            goto initializer_error;
    } else if (s->token.val == TOK_IN) {
        if (is_async)
            return js_parse_error(s, "'for await' loop should be used with 'of'");
        if (has_initializer &&
            (tok != TOK_VAR || (fd->js_mode & JS_MODE_STRICT) ||
             has_destructuring)) {
        initializer_error:
            return js_parse_error(s, "a declaration in the head of a for-%s loop can't have an initializer",
                                  is_for_of ? "of" : "in");
        }
    } else {
        return js_parse_error(s, "expected 'of' or 'in' in for control expression");
    }
    if (next_token(s))
        return -1;
    if (is_for_of) {
        if (js_parse_assign_expr(s))
            return -1;
    } else {
        if (js_parse_expr(s))
            return -1;
    }
    /* close the scope after having evaluated the expression so that
       the TDZ values are in the closures */
    close_scopes(s, s->cur_func->scope_level, block_scope_level);
    if (is_for_of) {
        if (is_async)
            emit_op(s, OP_for_await_of_start);
        else
            emit_op(s, OP_for_of_start);
        /* on stack: enum_rec */
    } else {
        emit_op(s, OP_for_in_start);
        /* on stack: enum_obj */
    }
    emit_goto(s, OP_goto, label_cont);

    if (js_parse_expect(s, ')'))
        return -1;

    if (OPTIMIZE) {
        /* move the `next` code here */
        DynBuf *bc = &s->cur_func->byte_code;
        int chunk_size = pos_expr - pos_next;
        int offset = bc->size - pos_next;
        int i;
        dbuf_realloc(bc, bc->size + chunk_size);
        dbuf_put(bc, bc->buf + pos_next, chunk_size);
        memset(bc->buf + pos_next, OP_nop, chunk_size);
        /* `next` part ends with a goto */
        s->cur_func->last_opcode_pos = bc->size - 5;
        /* relocate labels */
        for (i = label_cont; i < s->cur_func->label_count; i++) {
            LabelSlot *ls = &s->cur_func->label_slots[i];
            if (ls->pos >= pos_next && ls->pos < pos_expr)
                ls->pos += offset;
        }
    }

    emit_label(s, label_body);
    if (js_parse_statement(s))
        return -1;

    close_scopes(s, s->cur_func->scope_level, block_scope_level);

    emit_label(s, label_cont);
    if (is_for_of) {
        if (is_async) {
            /* call the next method */
            /* stack: iter_obj next catch_offset */
            emit_op(s, OP_dup3);
            emit_op(s, OP_drop);
            emit_op(s, OP_call_method);
            emit_u16(s, 0);
            /* get the result of the promise */
            emit_op(s, OP_await);
            /* unwrap the value and done values */
            emit_op(s, OP_iterator_get_value_done);
        } else {
            emit_op(s, OP_for_of_next);
            emit_u8(s, 0);
        }
    } else {
        emit_op(s, OP_for_in_next);
    }
    /* on stack: enum_rec / enum_obj value bool */
    emit_goto(s, OP_if_false, label_next);
    /* drop the undefined value from for_xx_next */
    emit_op(s, OP_drop);

    emit_label(s, label_break);
    if (is_for_of) {
        /* close and drop enum_rec */
        emit_op(s, OP_iterator_close);
    } else {
        emit_op(s, OP_drop);
    }
    pop_break_entry(s->cur_func);
    pop_scope(s);
    return 0;
}